

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animations.cpp
# Opt level: O3

FDoorAnimation * __thiscall
FTextureManager::FindAnimatedDoor(FTextureManager *this,FTextureID picnum)

{
  FDoorAnimation *pFVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->mAnimatedDoors).Count;
  if (uVar2 != 0) {
    pFVar1 = (this->mAnimatedDoors).Array;
    do {
      if ((pFVar1->BaseTexture).texnum == picnum.texnum) {
        return pFVar1;
      }
      pFVar1 = pFVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return (FDoorAnimation *)0x0;
}

Assistant:

FDoorAnimation *FTextureManager::FindAnimatedDoor (FTextureID picnum)
{
	unsigned int i;

	for (i = 0; i < mAnimatedDoors.Size(); ++i)
	{
		if (picnum == mAnimatedDoors[i].BaseTexture)
			return &mAnimatedDoors[i];
	}

	return NULL;
}